

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  printf("%.2fF = %.2fC\n",0x406a800000000000,0x4059000000000000);
  return 0;
}

Assistant:

int main() {

    float celsius;
    float fahrenheit;

    fahrenheit = 212.0f;
    celsius = (fahrenheit - 32.0f) / 1.8f;

    printf("%.2fF = %.2fC\n", fahrenheit, celsius);

    return 0;
}